

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnceReduction.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_22::Scanner::visitFunction(Scanner *this,Function *curr)

{
  Expression *pEVar1;
  char *pcVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  _Hash_node_base *p_Var7;
  Signature SVar8;
  undefined1 auStack_30 [8];
  Name global;
  
  SVar8 = HeapType::getSignature(&curr->type);
  if (SVar8.params.id.id == 0) {
    SVar8 = HeapType::getSignature(&curr->type);
    if (SVar8.results.id.id == 0) {
      pEVar1 = curr->body;
      auStack_30 = (undefined1  [8])0x0;
      global.super_IString.str._M_len = 0;
      if (pEVar1->_id == BlockId) {
        auStack_30 = (undefined1  [8])0x0;
        global.super_IString.str._M_len = 0;
        if (1 < pEVar1[2].type.id) {
          pcVar2 = (char *)**(undefined8 **)(pEVar1 + 2);
          auStack_30 = (undefined1  [8])0x0;
          global.super_IString.str._M_len = 0;
          if (*pcVar2 == '\x02') {
            pcVar3 = *(char **)(pcVar2 + 0x10);
            auStack_30 = (undefined1  [8])0x0;
            global.super_IString.str._M_len = 0;
            if (*pcVar3 == '\n') {
              auStack_30 = (undefined1  [8])0x0;
              global.super_IString.str._M_len = 0;
              if (**(char **)(pcVar2 + 0x18) == '\x13') {
                auStack_30 = (undefined1  [8])0x0;
                global.super_IString.str._M_len = 0;
                if (*(long *)(pcVar2 + 0x20) == 0) {
                  pcVar2 = (char *)(*(undefined8 **)(pEVar1 + 2))[1];
                  auStack_30 = (undefined1  [8])0x0;
                  global.super_IString.str._M_len = 0;
                  if (*pcVar2 == '\v') {
                    auStack_30 = (undefined1  [8])0x0;
                    global.super_IString.str._M_len = 0;
                    if (*(size_t *)(pcVar2 + 0x18) == *(size_t *)(pcVar3 + 0x18)) {
                      auStack_30 = (undefined1  [8])0x0;
                      global.super_IString.str._M_len = 0;
                      if (*(long *)(pcVar2 + 8) != 1) {
                        auStack_30 = *(undefined1 (*) [8])(pcVar3 + 0x10);
                        global.super_IString.str._M_len = *(size_t *)(pcVar3 + 0x18);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (global.super_IString.str._M_len != 0) {
        pmVar4 = std::__detail::
                 _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::at((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)&this->optInfo->onceFuncs,(key_type *)curr);
        (pmVar4->super_IString).str._M_len = (size_t)auStack_30;
        (pmVar4->super_IString).str._M_str = (char *)global.super_IString.str._M_len;
        pmVar5 = std::__detail::
                 _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->readGlobals,(key_type *)auStack_30);
        *pmVar5 = *pmVar5 - 1;
      }
    }
  }
  for (p_Var7 = (this->readGlobals)._M_h._M_before_begin._M_nxt; p_Var7 != (_Hash_node_base *)0x0;
      p_Var7 = p_Var7->_M_nxt) {
    if (*(int *)&p_Var7[3]._M_nxt != 0) {
      pmVar6 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)this->optInfo,(key_type *)(p_Var7 + 1));
      LOCK();
      (pmVar6->_M_base)._M_i = false;
      UNLOCK();
    }
  }
  return;
}

Assistant:

void visitFunction(Function* curr) {
    // TODO: support params and results?
    if (curr->getParams() == Type::none && curr->getResults() == Type::none) {
      auto global = getOnceGlobal(curr->body);
      if (global.is()) {
        // This is a "once" function, as best we can tell for now. Further
        // information may cause a problem, say, if the global is used in a bad
        // way in another function, so we may undo this.
        optInfo.onceFuncs.at(curr->name) = global;

        // We can ignore the get in the "once" pattern at the top of the
        // function.
        readGlobals[global]--;
      }
    }

    for (auto& [global, count] : readGlobals) {
      if (count > 0) {
        // This global has reads we cannot reason about, so do not optimize it.
        optInfo.onceGlobals.at(global) = false;
      }
    }
  }